

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O1

void google::protobuf::internal::ResetOneofField<(google::protobuf::internal::ProcessingType)4>
               (ParseTable *table,int field_number,Arena *arena,MessageLite *msg,uint32 *oneof_case,
               int64 offset,void *default_ptr)

{
  ParseTableField *pPVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  uint uVar5;
  undefined8 *puVar6;
  
  uVar5 = *oneof_case;
  if (uVar5 == field_number) {
    return;
  }
  if ((ulong)uVar5 == 0) goto LAB_0015f783;
  pPVar1 = table->fields + uVar5;
  uVar5 = pPVar1->processing_type & 0x1f;
  if (uVar5 < 0x17) {
    if (uVar5 != 9) {
      if (uVar5 == 0xb) {
        if ((arena == (Arena *)0x0) &&
           (plVar2 = *(long **)((long)&msg->_vptr_MessageLite + (ulong)pPVar1->offset),
           plVar2 != (long *)0x0)) {
          (**(code **)(*plVar2 + 8))();
        }
        goto LAB_0015f783;
      }
      if (uVar5 != 0xc) goto LAB_0015f783;
    }
    if ((arena != (Arena *)0x0) ||
       (puVar6 = *(undefined8 **)((long)&msg->_vptr_MessageLite + (ulong)pPVar1->offset),
       puVar6 == (undefined8 *)0x0 || puVar6 == &fixed_address_empty_string_abi_cxx11_))
    goto LAB_0015f783;
    if ((undefined8 *)*puVar6 != puVar6 + 2) {
      operator_delete((undefined8 *)*puVar6);
    }
  }
  else if ((1 < uVar5 - 0x17) ||
          (puVar3 = (undefined8 *)((long)&msg->_vptr_MessageLite + (ulong)pPVar1->offset),
          puVar6 = (undefined8 *)*puVar3, puVar6 == puVar3 + 2)) goto LAB_0015f783;
  operator_delete(puVar6);
LAB_0015f783:
  *oneof_case = field_number;
  plVar2 = (long *)table->aux[field_number].strings.default_ptr;
  uVar4 = (**(code **)(*plVar2 + 0x20))(plVar2,arena);
  *(undefined8 *)((long)&msg->_vptr_MessageLite + offset) = uVar4;
  return;
}

Assistant:

inline void ResetOneofField(const ParseTable& table, int field_number,
                            Arena* arena, MessageLite* msg, uint32* oneof_case,
                            int64 offset, const void* default_ptr) {
  if (*oneof_case == field_number) {
    // The oneof is already set to the right type, so there is no need to clear
    // it.
    return;
  }

  if (*oneof_case != 0) {
    ClearOneofField(table.fields[*oneof_case], arena, msg);
  }
  *oneof_case = field_number;

  switch (field_type) {
    case ProcessingType_STRING:
      Raw<ArenaStringPtr>(msg, offset)
          ->UnsafeSetDefault(static_cast<const std::string*>(default_ptr));
      break;
    case ProcessingType_INLINED:
      new (Raw<InlinedStringField>(msg, offset))
          InlinedStringField(*static_cast<const std::string*>(default_ptr));
      break;
    case ProcessingType_MESSAGE:
      MessageLite** submessage = Raw<MessageLite*>(msg, offset);
      const MessageLite* prototype =
          table.aux[field_number].messages.default_message();
      *submessage = prototype->New(arena);
      break;
  }
}